

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase471::run(TestCase471 *this)

{
  StructDataBitCount *this_00;
  Builder value;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  Builder value_03;
  Builder value_04;
  Builder value_05;
  Builder value_06;
  Builder value_07;
  Builder value_08;
  Builder value_09;
  Builder value_10;
  Builder value_11;
  Builder value_12;
  Builder value_13;
  Builder value_14;
  Builder value_15;
  Builder value_16;
  Builder value_17;
  Builder value_18;
  initializer_list<int> value_19;
  initializer_list<int> value_20;
  initializer_list<int> value_21;
  bool bVar1;
  undefined8 in_stack_ffffffffffffeda8;
  undefined8 uVar2;
  undefined7 in_stack_ffffffffffffedb0;
  undefined1 in_stack_ffffffffffffedb7;
  Builder local_11a8;
  StringTree local_1178;
  String local_1140;
  bool local_1121;
  undefined1 auStack_1120 [7];
  bool _kj_shouldLog_9;
  SegmentBuilder *pSStack_1118;
  CapTableBuilder *local_1110;
  void *pvStack_1108;
  WirePointer *local_1100;
  undefined8 uStack_10f8;
  StringTree local_10f0;
  String local_10b8;
  char (*local_10a0) [106];
  undefined1 local_1098 [8];
  DebugComparison<const_char_(&)[106],_kj::String> _kjCondition_9;
  Builder local_1050;
  StringTree local_1020;
  String local_fe8;
  bool local_fc9;
  undefined1 auStack_fc8 [7];
  bool _kj_shouldLog_8;
  SegmentBuilder *pSStack_fc0;
  CapTableBuilder *local_fb8;
  void *pvStack_fb0;
  WirePointer *local_fa8;
  undefined8 uStack_fa0;
  StringTree local_f98;
  String local_f60;
  char (*local_f48) [45];
  undefined1 local_f40 [8];
  DebugComparison<const_char_(&)[45],_kj::String> _kjCondition_8;
  Builder local_ef8;
  StringTree local_ec8;
  String local_e90;
  bool local_e71;
  undefined1 auStack_e70 [7];
  bool _kj_shouldLog_7;
  SegmentBuilder *pSStack_e68;
  CapTableBuilder *local_e60;
  void *pvStack_e58;
  WirePointer *local_e50;
  undefined8 uStack_e48;
  StringTree local_e40;
  String local_e08;
  char (*local_df0) [21];
  undefined1 local_de8 [8];
  DebugComparison<const_char_(&)[21],_kj::String> _kjCondition_7;
  undefined1 local_d88 [8];
  Builder s;
  Builder root_2;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  StringTree local_d08;
  String local_cd0;
  bool local_cb1;
  undefined1 auStack_cb0 [7];
  bool _kj_shouldLog_6;
  SegmentBuilder *pSStack_ca8;
  CapTableBuilder *local_ca0;
  void *pvStack_c98;
  WirePointer *local_c90;
  undefined8 uStack_c88;
  StringTree local_c80;
  String local_c48;
  char (*local_c30) [154];
  undefined1 local_c28 [8];
  DebugComparison<const_char_(&)[154],_kj::String> _kjCondition_6;
  Builder local_bc8;
  undefined1 local_ba0 [40];
  Builder local_b78;
  StringTree local_b48;
  String local_b10;
  bool local_af1;
  undefined1 auStack_af0 [7];
  bool _kj_shouldLog_5;
  SegmentBuilder *pSStack_ae8;
  CapTableBuilder *local_ae0;
  void *pvStack_ad8;
  WirePointer *local_ad0;
  undefined8 uStack_ac8;
  StringTree local_ac0;
  String local_a88;
  char (*local_a70) [144];
  undefined1 local_a68 [8];
  DebugComparison<const_char_(&)[144],_kj::String> _kjCondition_5;
  undefined1 auStack_a08 [8];
  Builder l8;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  StringTree local_9b0;
  String local_978;
  bool local_959;
  undefined1 auStack_958 [7];
  bool _kj_shouldLog_4;
  SegmentBuilder *pSStack_950;
  CapTableBuilder *local_948;
  void *pvStack_940;
  WirePointer *local_938;
  undefined8 uStack_930;
  StringTree local_928;
  String local_8f0;
  char (*local_8d8) [136];
  undefined1 local_8d0 [8];
  DebugComparison<const_char_(&)[136],_kj::String> _kjCondition_4;
  Builder local_870;
  StringTree local_840;
  String local_808;
  bool local_7e9;
  undefined1 auStack_7e8 [7];
  bool _kj_shouldLog_3;
  SegmentBuilder *pSStack_7e0;
  CapTableBuilder *local_7d8;
  void *pvStack_7d0;
  WirePointer *local_7c8;
  undefined8 uStack_7c0;
  StringTree local_7b8;
  String local_780;
  char (*local_768) [122];
  undefined1 local_760 [8];
  DebugComparison<const_char_(&)[122],_kj::String> _kjCondition_3;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  StringTree local_6f0;
  String local_6b8;
  bool local_699;
  undefined1 auStack_698 [7];
  bool _kj_shouldLog_2;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_690;
  SegmentBuilder *local_688;
  CapTableBuilder *pCStack_680;
  byte *local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  StringTree local_660;
  String local_628;
  char (*local_610) [94];
  undefined1 local_608 [8];
  DebugComparison<const_char_(&)[94],_kj::String> _kjCondition_2;
  int local_5b0 [4];
  iterator local_5a0;
  undefined8 local_598;
  int local_590 [4];
  iterator local_580;
  undefined8 local_578;
  undefined1 local_570 [8];
  Builder ll;
  Builder root_1;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  StringTree local_4f0;
  String local_4b8;
  bool local_499;
  undefined1 auStack_498 [7];
  bool _kj_shouldLog_1;
  SegmentBuilder *pSStack_490;
  CapTableBuilder *local_488;
  void *pvStack_480;
  WirePointer *local_478;
  undefined8 uStack_470;
  StringTree local_468;
  String local_430;
  char (*local_418) [169];
  undefined1 local_410 [8];
  DebugComparison<const_char_(&)[169],_kj::String> _kjCondition_1;
  Builder local_3c8;
  StringTree local_398;
  String local_360;
  bool local_341;
  undefined1 auStack_340 [7];
  bool _kj_shouldLog;
  SegmentBuilder *pSStack_338;
  CapTableBuilder *local_330;
  void *pvStack_328;
  WirePointer *local_320;
  undefined8 uStack_318;
  StringTree local_310;
  String local_2d8;
  char (*local_2c0) [149];
  undefined1 local_2b8 [8];
  DebugComparison<const_char_(&)[149],_kj::String> _kjCondition;
  Builder local_270;
  Builder local_248;
  ArrayPtr<const_char> local_220;
  Builder local_210;
  Builder local_1e8;
  ArrayPtr<const_char> local_1c0;
  Builder local_1b0;
  Builder local_188;
  undefined1 local_160 [8];
  Builder list;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase471 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestPrintInlineStructs>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestPrintInlineStructs::Builder::initStructList
            ((Builder *)local_160,(Builder *)local_128,3);
  List<capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct,_(capnp::Kind)3>::Builder::
  operator[](&local_188,(Builder *)local_160,0);
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setInt32Field
            (&local_188,0x7b);
  List<capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct,_(capnp::Kind)3>::Builder::
  operator[](&local_1b0,(Builder *)local_160,0);
  Text::Reader::Reader((Reader *)&local_1c0,"foo");
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setTextField
            (&local_1b0,(Reader)local_1c0);
  List<capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct,_(capnp::Kind)3>::Builder::
  operator[](&local_1e8,(Builder *)local_160,1);
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setInt32Field
            (&local_1e8,0x1c8);
  List<capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct,_(capnp::Kind)3>::Builder::
  operator[](&local_210,(Builder *)local_160,1);
  Text::Reader::Reader((Reader *)&local_220,"bar");
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setTextField
            (&local_210,(Reader)local_220);
  List<capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct,_(capnp::Kind)3>::Builder::
  operator[](&local_248,(Builder *)local_160,2);
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setInt32Field
            (&local_248,0x315);
  List<capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct,_(capnp::Kind)3>::Builder::
  operator[](&local_270,(Builder *)local_160,2);
  Text::Reader::Reader((Reader *)&_kjCondition.result,"baz");
  capnproto_test::capnp::test::TestPrintInlineStructs::InlineStruct::Builder::setTextField
            (&local_270,(Reader)stack0xfffffffffffffd80);
  local_2c0 = (char (*) [149])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [149])
                         "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
                        );
  DynamicStruct::Builder::
  Builder<capnproto_test::capnp::test::TestPrintInlineStructs::Builder&,void>
            ((Builder *)auStack_340,(Builder *)local_128);
  value.builder.segment = (SegmentBuilder *)local_330;
  value.schema.super_Schema.raw = (Schema)(Schema)pSStack_338;
  value.builder.capTable = (CapTableBuilder *)pvStack_328;
  value.builder.data = local_320;
  value.builder.pointers = (WirePointer *)uStack_318;
  value.builder.dataSize = (int)in_stack_ffffffffffffeda8;
  value.builder.pointerCount = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x20);
  value.builder._38_2_ = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x30);
  prettyPrint(value);
  kj::StringTree::flatten(&local_2d8,&local_310);
  kj::_::DebugExpression<char_const(&)[149]>::operator==
            ((DebugComparison<const_char_(&)[149],_kj::String> *)local_2b8,
             (DebugExpression<char_const(&)[149]> *)&local_2c0,&local_2d8);
  kj::String::~String(&local_2d8);
  kj::StringTree::~StringTree(&local_310);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b8);
  if (!bVar1) {
    local_341 = kj::_::Debug::shouldLog(ERROR);
    while (local_341 != false) {
      DynamicStruct::Builder::
      Builder<capnproto_test::capnp::test::TestPrintInlineStructs::Builder&,void>
                (&local_3c8,(Builder *)local_128);
      value_00.builder.segment = (SegmentBuilder *)local_3c8.builder.capTable;
      value_00.schema.super_Schema.raw = (Schema)(Schema)local_3c8.builder.segment;
      value_00.builder.capTable = (CapTableBuilder *)local_3c8.builder.data;
      value_00.builder.data = local_3c8.builder.pointers;
      value_00.builder.pointers = (WirePointer *)local_3c8.builder._32_8_;
      value_00.builder.dataSize = (int)in_stack_ffffffffffffeda8;
      value_00.builder.pointerCount = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x20);
      value_00.builder._38_2_ = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x30);
      prettyPrint(value_00);
      kj::StringTree::flatten(&local_360,&local_398);
      kj::_::Debug::
      log<char_const(&)[221],kj::_::DebugComparison<char_const(&)[149],kj::String>&,char_const(&)[149],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x1ea,ERROR,
                 "\"failed: expected \" \"(\\\"( structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
                 ,(char (*) [221])
                  "failed: expected (\"( structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[149],_kj::String> *)local_2b8,
                 (char (*) [149])
                 "( structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
                 ,&local_360);
      kj::String::~String(&local_360);
      kj::StringTree::~StringTree(&local_398);
      local_341 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[149],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[149],_kj::String> *)local_2b8);
  Text::Reader::Reader((Reader *)&_kjCondition_1.result,"foo");
  capnproto_test::capnp::test::TestPrintInlineStructs::Builder::setSomeText
            ((Builder *)local_128,(Reader)stack0xfffffffffffffc28);
  local_418 = (char (*) [169])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [169])
                         "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
                        );
  DynamicStruct::Builder::
  Builder<capnproto_test::capnp::test::TestPrintInlineStructs::Builder&,void>
            ((Builder *)auStack_498,(Builder *)local_128);
  value_01.builder.segment = (SegmentBuilder *)local_488;
  value_01.schema.super_Schema.raw = (Schema)(Schema)pSStack_490;
  value_01.builder.capTable = (CapTableBuilder *)pvStack_480;
  value_01.builder.data = local_478;
  value_01.builder.pointers = (WirePointer *)uStack_470;
  value_01.builder.dataSize = (int)in_stack_ffffffffffffeda8;
  value_01.builder.pointerCount = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x20);
  value_01.builder._38_2_ = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x30);
  prettyPrint(value_01);
  kj::StringTree::flatten(&local_430,&local_468);
  kj::_::DebugExpression<char_const(&)[169]>::operator==
            ((DebugComparison<const_char_(&)[169],_kj::String> *)local_410,
             (DebugExpression<char_const(&)[169]> *)&local_418,&local_430);
  kj::String::~String(&local_430);
  kj::StringTree::~StringTree(&local_468);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_410);
  if (!bVar1) {
    local_499 = kj::_::Debug::shouldLog(ERROR);
    while (local_499 != false) {
      DynamicStruct::Builder::
      Builder<capnproto_test::capnp::test::TestPrintInlineStructs::Builder&,void>
                ((Builder *)&root_1._builder.dataSize,(Builder *)local_128);
      value_02.builder.segment = (SegmentBuilder *)local_510;
      value_02.schema.super_Schema.raw = (Schema)(Schema)uStack_518;
      value_02.builder.capTable = (CapTableBuilder *)uStack_508;
      value_02.builder.data = (void *)local_500;
      value_02.builder.pointers = (WirePointer *)uStack_4f8;
      value_02.builder.dataSize = (int)in_stack_ffffffffffffeda8;
      value_02.builder.pointerCount = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x20);
      value_02.builder._38_2_ = (short)((ulong)in_stack_ffffffffffffeda8 >> 0x30);
      prettyPrint(value_02);
      kj::StringTree::flatten(&local_4b8,&local_4f0);
      kj::_::Debug::
      log<char_const(&)[247],kj::_::DebugComparison<char_const(&)[169],kj::String>&,char_const(&)[169],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,500,ERROR,
                 "\"failed: expected \" \"(\\\"( someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"  structList = [\\\\n\\\" \\\"    (int32Field = 123, textField = \\\\\\\"foo\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 456, textField = \\\\\\\"bar\\\\\\\"),\\\\n\\\" \\\"    (int32Field = 789, textField = \\\\\\\"baz\\\\\\\") ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\", prettyPrint(root).flatten()"
                 ,(char (*) [247])
                  "failed: expected (\"( someText = \\\"foo\\\",\\n\" \"  structList = [\\n\" \"    (int32Field = 123, textField = \\\"foo\\\"),\\n\" \"    (int32Field = 456, textField = \\\"bar\\\"),\\n\" \"    (int32Field = 789, textField = \\\"baz\\\") ] )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[169],_kj::String> *)local_410,
                 (char (*) [169])
                 "( someText = \"foo\",\n  structList = [\n    (int32Field = 123, textField = \"foo\"),\n    (int32Field = 456, textField = \"bar\"),\n    (int32Field = 789, textField = \"baz\") ] )"
                 ,&local_4b8);
      kj::String::~String(&local_4b8);
      kj::StringTree::~StringTree(&local_4f0);
      local_499 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[169],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[169],_kj::String> *)local_410);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestLists>
            ((Builder *)&ll.builder.structDataSize,(MessageBuilder *)&root._builder.dataSize);
  capnproto_test::capnp::test::TestLists::Builder::initInt32ListList
            ((Builder *)local_570,(Builder *)&ll.builder.structDataSize,3);
  local_590[0] = 0x7b;
  local_590[1] = 0x1c8;
  local_590[2] = 0x315;
  local_590[3] = 0x499602d2;
  local_580 = local_590;
  local_578 = 4;
  value_21._M_len = 4;
  value_21._M_array = local_580;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_570,0,value_21);
  local_5b0[0] = 0xea;
  local_5b0[1] = 0x237;
  local_5b0[2] = 0x37b;
  local_5b0[3] = 0x499602d2;
  local_5a0 = local_5b0;
  local_598 = 4;
  value_20._M_len = 4;
  value_20._M_array = local_5a0;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_570,1,value_20);
  _kjCondition_2.result = true;
  _kjCondition_2._49_3_ = 1;
  _kjCondition_2._52_4_ = 0x2a6;
  value_19._M_len = 4;
  value_19._M_array = (iterator)&_kjCondition_2.result;
  List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
            ((Builder *)local_570,2,value_19);
  local_610 = (char (*) [94])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [94])
                         "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
                        );
  DynamicList::Builder::
  Builder<capnp::List<capnp::List<int,(capnp::Kind)0>,(capnp::Kind)6>::Builder&,void>
            ((Builder *)auStack_698,(Builder *)local_570);
  value_17.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_688;
  value_17.schema.elementType._0_8_ = aStack_690.schema;
  value_17.builder.segment = (SegmentBuilder *)pCStack_680;
  value_17.builder.capTable = (CapTableBuilder *)local_678;
  value_17.builder.ptr = (byte *)uStack_670;
  value_17.builder._24_8_ = local_668;
  value_17.builder.structDataSize = (int)in_stack_ffffffffffffedb0;
  value_17.builder.structPointerCount = (short)((uint7)in_stack_ffffffffffffedb0 >> 0x20);
  value_17.builder.elementSize = (char)((uint7)in_stack_ffffffffffffedb0 >> 0x30);
  value_17.builder._39_1_ = in_stack_ffffffffffffedb7;
  prettyPrint(value_17);
  kj::StringTree::flatten(&local_628,&local_660);
  kj::_::DebugExpression<char_const(&)[94]>::operator==
            ((DebugComparison<const_char_(&)[94],_kj::String> *)local_608,
             (DebugExpression<char_const(&)[94]> *)&local_610,&local_628);
  kj::String::~String(&local_628);
  kj::StringTree::~StringTree(&local_660);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_608);
  uVar2 = local_668;
  if (!bVar1) {
    local_699 = kj::_::Debug::shouldLog(ERROR);
    uVar2 = local_668;
    while (local_699 != false) {
      DynamicList::Builder::
      Builder<capnp::List<capnp::List<int,(capnp::Kind)0>,(capnp::Kind)6>::Builder&,void>
                ((Builder *)&_kjCondition_3.result,(Builder *)local_570);
      value_18.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_718;
      value_18.schema.elementType._0_8_ = uStack_720;
      value_18.builder.segment = (SegmentBuilder *)uStack_710;
      value_18.builder.capTable = (CapTableBuilder *)local_708;
      value_18.builder.ptr = (byte *)uStack_700;
      value_18.builder._24_8_ = local_6f8;
      value_18.builder.structDataSize = (int)in_stack_ffffffffffffedb0;
      value_18.builder.structPointerCount = (short)((uint7)in_stack_ffffffffffffedb0 >> 0x20);
      value_18.builder.elementSize = (char)((uint7)in_stack_ffffffffffffedb0 >> 0x30);
      value_18.builder._39_1_ = in_stack_ffffffffffffedb7;
      uVar2 = local_6f8;
      prettyPrint(value_18);
      kj::StringTree::flatten(&local_6b8,&local_6f0);
      kj::_::Debug::
      log<char_const(&)[154],kj::_::DebugComparison<char_const(&)[94],kj::String>&,char_const(&)[94],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x202,ERROR,
                 "\"failed: expected \" \"(\\\"[ [123, 456, 789, 1234567890],\\\\n\\\" \\\"  [234, 567, 891, 1234567890],\\\\n\\\" \\\"  [345, 678, 912, 1234567890] ]\\\") == (prettyPrint(ll).flatten())\", _kjCondition, \"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\", prettyPrint(ll).flatten()"
                 ,(char (*) [154])
                  "failed: expected (\"[ [123, 456, 789, 1234567890],\\n\" \"  [234, 567, 891, 1234567890],\\n\" \"  [345, 678, 912, 1234567890] ]\") == (prettyPrint(ll).flatten())"
                 ,(DebugComparison<const_char_(&)[94],_kj::String> *)local_608,
                 (char (*) [94])
                 "[ [123, 456, 789, 1234567890],\n  [234, 567, 891, 1234567890],\n  [345, 678, 912, 1234567890] ]"
                 ,&local_6b8);
      kj::String::~String(&local_6b8);
      kj::StringTree::~StringTree(&local_6f0);
      local_699 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[94],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[94],_kj::String> *)local_608);
  local_768 = (char (*) [122])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [122])
                         "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                        );
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
            ((Builder *)auStack_7e8,(Builder *)&ll.builder.structDataSize);
  value_03.builder.segment = (SegmentBuilder *)local_7d8;
  value_03.schema.super_Schema.raw = (Schema)(Schema)pSStack_7e0;
  value_03.builder.capTable = (CapTableBuilder *)pvStack_7d0;
  value_03.builder.data = local_7c8;
  value_03.builder.pointers = (WirePointer *)uStack_7c0;
  value_03.builder.dataSize = (StructDataBitCount)uVar2;
  value_03.builder.pointerCount = SUB82(uVar2,4);
  value_03.builder._38_1_ = SUB81(uVar2,6);
  value_03.builder._39_1_ = SUB81(uVar2,7);
  prettyPrint(value_03);
  kj::StringTree::flatten(&local_780,&local_7b8);
  kj::_::DebugExpression<char_const(&)[122]>::operator==
            ((DebugComparison<const_char_(&)[122],_kj::String> *)local_760,
             (DebugExpression<char_const(&)[122]> *)&local_768,&local_780);
  kj::String::~String(&local_780);
  kj::StringTree::~StringTree(&local_7b8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_760);
  if (!bVar1) {
    local_7e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_7e9 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
                (&local_870,(Builder *)&ll.builder.structDataSize);
      value_04.builder.segment = (SegmentBuilder *)local_870.builder.capTable;
      value_04.schema.super_Schema.raw = (Schema)(Schema)local_870.builder.segment;
      value_04.builder.capTable = (CapTableBuilder *)local_870.builder.data;
      value_04.builder.data = local_870.builder.pointers;
      value_04.builder.pointers = (WirePointer *)local_870.builder._32_8_;
      value_04.builder.dataSize = (StructDataBitCount)uVar2;
      value_04.builder.pointerCount = SUB82(uVar2,4);
      value_04.builder._38_1_ = SUB81(uVar2,6);
      value_04.builder._39_1_ = SUB81(uVar2,7);
      prettyPrint(value_04);
      kj::StringTree::flatten(&local_808,&local_840);
      kj::_::Debug::
      log<char_const(&)[188],kj::_::DebugComparison<char_const(&)[122],kj::String>&,char_const(&)[122],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x209,ERROR,
                 "\"failed: expected \" \"(\\\"( int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
                 ,(char (*) [188])
                  "failed: expected (\"( int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[122],_kj::String> *)local_760,
                 (char (*) [122])
                 "( int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                 ,&local_808);
      kj::String::~String(&local_808);
      kj::StringTree::~StringTree(&local_840);
      local_7e9 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[122],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[122],_kj::String> *)local_760);
  capnproto_test::capnp::test::TestLists::Builder::initList8
            ((Builder *)&_kjCondition_4.result,(Builder *)&ll.builder.structDataSize,0);
  local_8d8 = (char (*) [136])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [136])
                         "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                        );
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
            ((Builder *)auStack_958,(Builder *)&ll.builder.structDataSize);
  value_05.builder.segment = (SegmentBuilder *)local_948;
  value_05.schema.super_Schema.raw = (Schema)(Schema)pSStack_950;
  value_05.builder.capTable = (CapTableBuilder *)pvStack_940;
  value_05.builder.data = local_938;
  value_05.builder.pointers = (WirePointer *)uStack_930;
  value_05.builder.dataSize = (StructDataBitCount)uVar2;
  value_05.builder.pointerCount = SUB82(uVar2,4);
  value_05.builder._38_1_ = SUB81(uVar2,6);
  value_05.builder._39_1_ = SUB81(uVar2,7);
  prettyPrint(value_05);
  kj::StringTree::flatten(&local_8f0,&local_928);
  kj::_::DebugExpression<char_const(&)[136]>::operator==
            ((DebugComparison<const_char_(&)[136],_kj::String> *)local_8d0,
             (DebugExpression<char_const(&)[136]> *)&local_8d8,&local_8f0);
  kj::String::~String(&local_8f0);
  kj::StringTree::~StringTree(&local_928);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_8d0);
  if (!bVar1) {
    local_959 = kj::_::Debug::shouldLog(ERROR);
    while (local_959 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
                ((Builder *)&l8.builder.structDataSize,(Builder *)&ll.builder.structDataSize);
      value_06.builder.segment = (SegmentBuilder *)local_9d0;
      value_06.schema.super_Schema.raw = (Schema)(Schema)uStack_9d8;
      value_06.builder.capTable = (CapTableBuilder *)uStack_9c8;
      value_06.builder.data = (void *)local_9c0;
      value_06.builder.pointers = (WirePointer *)uStack_9b8;
      value_06.builder.dataSize = (StructDataBitCount)uVar2;
      value_06.builder.pointerCount = SUB82(uVar2,4);
      value_06.builder._38_1_ = SUB81(uVar2,6);
      value_06.builder._39_1_ = SUB81(uVar2,7);
      prettyPrint(value_06);
      kj::StringTree::flatten(&local_978,&local_9b0);
      kj::_::Debug::
      log<char_const(&)[206],kj::_::DebugComparison<char_const(&)[136],kj::String>&,char_const(&)[136],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x213,ERROR,
                 "\"failed: expected \" \"(\\\"( list8 = [],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
                 ,(char (*) [206])
                  "failed: expected (\"( list8 = [],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[136],_kj::String> *)local_8d0,
                 (char (*) [136])
                 "( list8 = [],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                 ,&local_978);
      kj::String::~String(&local_978);
      kj::StringTree::~StringTree(&local_9b0);
      local_959 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[136],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[136],_kj::String> *)local_8d0);
  capnproto_test::capnp::test::TestLists::Builder::initList8
            ((Builder *)auStack_a08,(Builder *)&ll.builder.structDataSize,1);
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&_kjCondition_5.result,(Builder *)auStack_a08,0);
  capnproto_test::capnp::test::TestLists::Struct8::Builder::setF
            ((Builder *)&_kjCondition_5.result,'\f');
  local_a70 = (char (*) [144])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [144])
                         "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                        );
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
            ((Builder *)auStack_af0,(Builder *)&ll.builder.structDataSize);
  value_07.builder.segment = (SegmentBuilder *)local_ae0;
  value_07.schema.super_Schema.raw = (Schema)(Schema)pSStack_ae8;
  value_07.builder.capTable = (CapTableBuilder *)pvStack_ad8;
  value_07.builder.data = local_ad0;
  value_07.builder.pointers = (WirePointer *)uStack_ac8;
  value_07.builder.dataSize = (StructDataBitCount)uVar2;
  value_07.builder.pointerCount = SUB82(uVar2,4);
  value_07.builder._38_1_ = SUB81(uVar2,6);
  value_07.builder._39_1_ = SUB81(uVar2,7);
  prettyPrint(value_07);
  kj::StringTree::flatten(&local_a88,&local_ac0);
  kj::_::DebugExpression<char_const(&)[144]>::operator==
            ((DebugComparison<const_char_(&)[144],_kj::String> *)local_a68,
             (DebugExpression<char_const(&)[144]> *)&local_a70,&local_a88);
  kj::String::~String(&local_a88);
  kj::StringTree::~StringTree(&local_ac0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a68);
  if (!bVar1) {
    local_af1 = kj::_::Debug::shouldLog(ERROR);
    while (local_af1 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
                (&local_b78,(Builder *)&ll.builder.structDataSize);
      value_08.builder.segment = (SegmentBuilder *)local_b78.builder.capTable;
      value_08.schema.super_Schema.raw = (Schema)(Schema)local_b78.builder.segment;
      value_08.builder.capTable = (CapTableBuilder *)local_b78.builder.data;
      value_08.builder.data = local_b78.builder.pointers;
      value_08.builder.pointers = (WirePointer *)local_b78.builder._32_8_;
      value_08.builder.dataSize = (StructDataBitCount)uVar2;
      value_08.builder.pointerCount = SUB82(uVar2,4);
      value_08.builder._38_1_ = SUB81(uVar2,6);
      value_08.builder._39_1_ = SUB81(uVar2,7);
      prettyPrint(value_08);
      kj::StringTree::flatten(&local_b10,&local_b48);
      kj::_::Debug::
      log<char_const(&)[214],kj::_::DebugComparison<char_const(&)[144],kj::String>&,char_const(&)[144],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x21e,ERROR,
                 "\"failed: expected \" \"(\\\"( list8 = [(f = 12)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
                 ,(char (*) [214])
                  "failed: expected (\"( list8 = [(f = 12)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[144],_kj::String> *)local_a68,
                 (char (*) [144])
                 "( list8 = [(f = 12)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                 ,&local_b10);
      kj::String::~String(&local_b10);
      kj::StringTree::~StringTree(&local_b48);
      local_af1 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[144],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[144],_kj::String> *)local_a68);
  capnproto_test::capnp::test::TestLists::Builder::initList8
            ((Builder *)local_ba0,(Builder *)&ll.builder.structDataSize,2);
  l8.builder.elementCount = local_ba0._32_4_;
  l8.builder.step = local_ba0._36_4_;
  l8.builder.capTable = (CapTableBuilder *)local_ba0._16_8_;
  l8.builder.ptr = (byte *)local_ba0._24_8_;
  auStack_a08 = (undefined1  [8])local_ba0._0_8_;
  l8.builder.segment = (SegmentBuilder *)local_ba0._8_8_;
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            (&local_bc8,(Builder *)auStack_a08,0);
  capnproto_test::capnp::test::TestLists::Struct8::Builder::setF(&local_bc8,'\f');
  List<capnproto_test::capnp::test::TestLists::Struct8,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)&_kjCondition_6.result,(Builder *)auStack_a08,1);
  capnproto_test::capnp::test::TestLists::Struct8::Builder::setF
            ((Builder *)&_kjCondition_6.result,'\"');
  local_c30 = (char (*) [154])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [154])
                         "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                        );
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
            ((Builder *)auStack_cb0,(Builder *)&ll.builder.structDataSize);
  value_09.builder.segment = (SegmentBuilder *)local_ca0;
  value_09.schema.super_Schema.raw = (Schema)(Schema)pSStack_ca8;
  value_09.builder.capTable = (CapTableBuilder *)pvStack_c98;
  value_09.builder.data = local_c90;
  value_09.builder.pointers = (WirePointer *)uStack_c88;
  value_09.builder.dataSize = (StructDataBitCount)uVar2;
  value_09.builder.pointerCount = SUB82(uVar2,4);
  value_09.builder._38_1_ = SUB81(uVar2,6);
  value_09.builder._39_1_ = SUB81(uVar2,7);
  prettyPrint(value_09);
  kj::StringTree::flatten(&local_c48,&local_c80);
  kj::_::DebugExpression<char_const(&)[154]>::operator==
            ((DebugComparison<const_char_(&)[154],_kj::String> *)local_c28,
             (DebugExpression<char_const(&)[154]> *)&local_c30,&local_c48);
  kj::String::~String(&local_c48);
  kj::StringTree::~StringTree(&local_c80);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c28);
  if (!bVar1) {
    local_cb1 = kj::_::Debug::shouldLog(ERROR);
    while (local_cb1 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestLists::Builder&,void>
                ((Builder *)&root_2._builder.dataSize,(Builder *)&ll.builder.structDataSize);
      value_10.builder.segment = (SegmentBuilder *)local_d28;
      value_10.schema.super_Schema.raw = (Schema)(Schema)uStack_d30;
      value_10.builder.capTable = (CapTableBuilder *)uStack_d20;
      value_10.builder.data = (void *)local_d18;
      value_10.builder.pointers = (WirePointer *)uStack_d10;
      value_10.builder.dataSize = (StructDataBitCount)uVar2;
      value_10.builder.pointerCount = SUB82(uVar2,4);
      value_10.builder._38_1_ = SUB81(uVar2,6);
      value_10.builder._39_1_ = SUB81(uVar2,7);
      prettyPrint(value_10);
      kj::StringTree::flatten(&local_cd0,&local_d08);
      kj::_::Debug::
      log<char_const(&)[224],kj::_::DebugComparison<char_const(&)[154],kj::String>&,char_const(&)[154],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x22a,ERROR,
                 "\"failed: expected \" \"(\\\"( list8 = [(f = 12), (f = 34)],\\\\n\\\" \\\"  int32ListList = [\\\\n\\\" \\\"    [123, 456, 789, 1234567890],\\\\n\\\" \\\"    [234, 567, 891, 1234567890],\\\\n\\\" \\\"    [345, 678, 912, 1234567890] ] )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\", prettyPrint(root).flatten()"
                 ,(char (*) [224])
                  "failed: expected (\"( list8 = [(f = 12), (f = 34)],\\n\" \"  int32ListList = [\\n\" \"    [123, 456, 789, 1234567890],\\n\" \"    [234, 567, 891, 1234567890],\\n\" \"    [345, 678, 912, 1234567890] ] )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[154],_kj::String> *)local_c28,
                 (char (*) [154])
                 "( list8 = [(f = 12), (f = 34)],\n  int32ListList = [\n    [123, 456, 789, 1234567890],\n    [234, 567, 891, 1234567890],\n    [345, 678, 912, 1234567890] ] )"
                 ,&local_cd0);
      kj::String::~String(&local_cd0);
      kj::StringTree::~StringTree(&local_d08);
      local_cb1 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[154],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[154],_kj::String> *)local_c28);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestStructUnion>
            ((Builder *)&s._builder.dataSize,(MessageBuilder *)&root._builder.dataSize);
  capnproto_test::capnp::test::TestStructUnion::Builder::getUn
            ((Builder *)&_kjCondition_7.result,(Builder *)&s._builder.dataSize);
  capnproto_test::capnp::test::TestStructUnion::Un::Builder::initStruct
            ((Builder *)local_d88,(Builder *)&_kjCondition_7.result);
  local_df0 = (char (*) [21])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [21])"(un = (struct = ()))");
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestStructUnion::Builder&,void>
            ((Builder *)auStack_e70,(Builder *)&s._builder.dataSize);
  value_11.builder.segment = (SegmentBuilder *)local_e60;
  value_11.schema.super_Schema.raw = (Schema)(Schema)pSStack_e68;
  value_11.builder.capTable = (CapTableBuilder *)pvStack_e58;
  value_11.builder.data = local_e50;
  value_11.builder.pointers = (WirePointer *)uStack_e48;
  value_11.builder.dataSize = (StructDataBitCount)uVar2;
  value_11.builder.pointerCount = SUB82(uVar2,4);
  value_11.builder._38_1_ = SUB81(uVar2,6);
  value_11.builder._39_1_ = SUB81(uVar2,7);
  prettyPrint(value_11);
  kj::StringTree::flatten(&local_e08,&local_e40);
  kj::_::DebugExpression<char_const(&)[21]>::operator==
            ((DebugComparison<const_char_(&)[21],_kj::String> *)local_de8,
             (DebugExpression<char_const(&)[21]> *)&local_df0,&local_e08);
  kj::String::~String(&local_e08);
  kj::StringTree::~StringTree(&local_e40);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_de8);
  if (!bVar1) {
    local_e71 = kj::_::Debug::shouldLog(ERROR);
    while (local_e71 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestStructUnion::Builder&,void>
                (&local_ef8,(Builder *)&s._builder.dataSize);
      value_12.builder.segment = (SegmentBuilder *)local_ef8.builder.capTable;
      value_12.schema.super_Schema.raw = (Schema)(Schema)local_ef8.builder.segment;
      value_12.builder.capTable = (CapTableBuilder *)local_ef8.builder.data;
      value_12.builder.data = local_ef8.builder.pointers;
      value_12.builder.pointers = (WirePointer *)local_ef8.builder._32_8_;
      value_12.builder.dataSize = (StructDataBitCount)uVar2;
      value_12.builder.pointerCount = SUB82(uVar2,4);
      value_12.builder._38_1_ = SUB81(uVar2,6);
      value_12.builder._39_1_ = SUB81(uVar2,7);
      prettyPrint(value_12);
      kj::StringTree::flatten(&local_e90,&local_ec8);
      kj::_::Debug::
      log<char_const(&)[75],kj::_::DebugComparison<char_const(&)[21],kj::String>&,char_const(&)[21],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x233,ERROR,
                 "\"failed: expected \" \"(\\\"(un = (struct = ()))\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"(un = (struct = ()))\", prettyPrint(root).flatten()"
                 ,(char (*) [75])
                  "failed: expected (\"(un = (struct = ()))\") == (prettyPrint(root).flatten())",
                 (DebugComparison<const_char_(&)[21],_kj::String> *)local_de8,
                 (char (*) [21])"(un = (struct = ()))",&local_e90);
      kj::String::~String(&local_e90);
      kj::StringTree::~StringTree(&local_ec8);
      local_e71 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[21],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[21],_kj::String> *)local_de8);
  Text::Reader::Reader((Reader *)&_kjCondition_8.result,"foo");
  capnproto_test::capnp::test::TestStructUnion::SomeStruct::Builder::setSomeText
            ((Builder *)local_d88,(Reader)stack0xfffffffffffff0f8);
  local_f48 = (char (*) [45])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [45])"( un = (\n    struct = (someText = \"foo\") ) )");
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestStructUnion::Builder&,void>
            ((Builder *)auStack_fc8,(Builder *)&s._builder.dataSize);
  value_13.builder.segment = (SegmentBuilder *)local_fb8;
  value_13.schema.super_Schema.raw = (Schema)(Schema)pSStack_fc0;
  value_13.builder.capTable = (CapTableBuilder *)pvStack_fb0;
  value_13.builder.data = local_fa8;
  value_13.builder.pointers = (WirePointer *)uStack_fa0;
  value_13.builder.dataSize = (StructDataBitCount)uVar2;
  value_13.builder.pointerCount = SUB82(uVar2,4);
  value_13.builder._38_1_ = SUB81(uVar2,6);
  value_13.builder._39_1_ = SUB81(uVar2,7);
  prettyPrint(value_13);
  kj::StringTree::flatten(&local_f60,&local_f98);
  kj::_::DebugExpression<char_const(&)[45]>::operator==
            ((DebugComparison<const_char_(&)[45],_kj::String> *)local_f40,
             (DebugExpression<char_const(&)[45]> *)&local_f48,&local_f60);
  kj::String::~String(&local_f60);
  kj::StringTree::~StringTree(&local_f98);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f40);
  if (!bVar1) {
    local_fc9 = kj::_::Debug::shouldLog(ERROR);
    while (local_fc9 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestStructUnion::Builder&,void>
                (&local_1050,(Builder *)&s._builder.dataSize);
      value_14.builder.segment = (SegmentBuilder *)local_1050.builder.capTable;
      value_14.schema.super_Schema.raw = (Schema)(Schema)local_1050.builder.segment;
      value_14.builder.capTable = (CapTableBuilder *)local_1050.builder.data;
      value_14.builder.data = local_1050.builder.pointers;
      value_14.builder.pointers = (WirePointer *)local_1050.builder._32_8_;
      value_14.builder.dataSize = (StructDataBitCount)uVar2;
      value_14.builder.pointerCount = SUB82(uVar2,4);
      value_14.builder._38_1_ = SUB81(uVar2,6);
      value_14.builder._39_1_ = SUB81(uVar2,7);
      prettyPrint(value_14);
      kj::StringTree::flatten(&local_fe8,&local_1020);
      kj::_::Debug::
      log<char_const(&)[105],kj::_::DebugComparison<char_const(&)[45],kj::String>&,char_const(&)[45],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x239,ERROR,
                 "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (someText = \\\\\\\"foo\\\\\\\") ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\", prettyPrint(root).flatten()"
                 ,(char (*) [105])
                  "failed: expected (\"( un = (\\n\" \"    struct = (someText = \\\"foo\\\") ) )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[45],_kj::String> *)local_f40,
                 (char (*) [45])"( un = (\n    struct = (someText = \"foo\") ) )",&local_fe8);
      kj::String::~String(&local_fe8);
      kj::StringTree::~StringTree(&local_1020);
      local_fc9 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[45],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[45],_kj::String> *)local_f40);
  Text::Reader::Reader((Reader *)&_kjCondition_9.result,"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar");
  capnproto_test::capnp::test::TestStructUnion::SomeStruct::Builder::setMoreText
            ((Builder *)local_d88,(Reader)stack0xffffffffffffefa0);
  local_10a0 = (char (*) [106])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (char (*) [106])
                          "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
                         );
  DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestStructUnion::Builder&,void>
            ((Builder *)auStack_1120,(Builder *)&s._builder.dataSize);
  value_15.builder.segment = (SegmentBuilder *)local_1110;
  value_15.schema.super_Schema.raw = (Schema)(Schema)pSStack_1118;
  value_15.builder.capTable = (CapTableBuilder *)pvStack_1108;
  value_15.builder.data = local_1100;
  value_15.builder.pointers = (WirePointer *)uStack_10f8;
  value_15.builder.dataSize = (StructDataBitCount)uVar2;
  value_15.builder.pointerCount = SUB82(uVar2,4);
  value_15.builder._38_1_ = SUB81(uVar2,6);
  value_15.builder._39_1_ = SUB81(uVar2,7);
  prettyPrint(value_15);
  kj::StringTree::flatten(&local_10b8,&local_10f0);
  kj::_::DebugExpression<char_const(&)[106]>::operator==
            ((DebugComparison<const_char_(&)[106],_kj::String> *)local_1098,
             (DebugExpression<char_const(&)[106]> *)&local_10a0,&local_10b8);
  kj::String::~String(&local_10b8);
  kj::StringTree::~StringTree(&local_10f0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1098);
  if (!bVar1) {
    local_1121 = kj::_::Debug::shouldLog(ERROR);
    while (local_1121 != false) {
      DynamicStruct::Builder::Builder<capnproto_test::capnp::test::TestStructUnion::Builder&,void>
                (&local_11a8,(Builder *)&s._builder.dataSize);
      value_16.builder.segment = (SegmentBuilder *)local_11a8.builder.capTable;
      value_16.schema.super_Schema.raw = (Schema)(Schema)local_11a8.builder.segment;
      value_16.builder.capTable = (CapTableBuilder *)local_11a8.builder.data;
      value_16.builder.data = local_11a8.builder.pointers;
      value_16.builder.pointers = (WirePointer *)local_11a8.builder._32_8_;
      value_16.builder.dataSize = (StructDataBitCount)uVar2;
      value_16.builder.pointerCount = SUB82(uVar2,4);
      value_16.builder._38_1_ = SUB81(uVar2,6);
      value_16.builder._39_1_ = SUB81(uVar2,7);
      prettyPrint(value_16);
      kj::StringTree::flatten(&local_1140,&local_1178);
      kj::_::Debug::
      log<char_const(&)[176],kj::_::DebugComparison<char_const(&)[106],kj::String>&,char_const(&)[106],kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x241,ERROR,
                 "\"failed: expected \" \"(\\\"( un = (\\\\n\\\" \\\"    struct = (\\\\n\\\" \\\"      someText = \\\\\\\"foo\\\\\\\",\\\\n\\\" \\\"      moreText = \\\\\\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\\\\\" ) ) )\\\") == (prettyPrint(root).flatten())\", _kjCondition, \"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\", prettyPrint(root).flatten()"
                 ,(char (*) [176])
                  "failed: expected (\"( un = (\\n\" \"    struct = (\\n\" \"      someText = \\\"foo\\\",\\n\" \"      moreText = \\\"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\\\" ) ) )\") == (prettyPrint(root).flatten())"
                 ,(DebugComparison<const_char_(&)[106],_kj::String> *)local_1098,
                 (char (*) [106])
                 "( un = (\n    struct = (\n      someText = \"foo\",\n      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )"
                 ,&local_1140);
      kj::String::~String(&local_1140);
      kj::StringTree::~StringTree(&local_1178);
      local_1121 = false;
    }
  }
  kj::_::DebugComparison<const_char_(&)[106],_kj::String>::~DebugComparison
            ((DebugComparison<const_char_(&)[106],_kj::String> *)local_1098);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Stringify, PrettyPrintAdvanced) {
  MallocMessageBuilder builder;

  {
    auto root = builder.initRoot<test::TestPrintInlineStructs>();

    auto list = root.initStructList(3);
    list[0].setInt32Field(123);
    list[0].setTextField("foo");
    list[1].setInt32Field(456);
    list[1].setTextField("bar");
    list[2].setInt32Field(789);
    list[2].setTextField("baz");

    EXPECT_EQ(
        "( structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());

    root.setSomeText("foo");

    EXPECT_EQ(
        "( someText = \"foo\",\n"
        "  structList = [\n"
        "    (int32Field = 123, textField = \"foo\"),\n"
        "    (int32Field = 456, textField = \"bar\"),\n"
        "    (int32Field = 789, textField = \"baz\") ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestLists>();
    auto ll = root.initInt32ListList(3);
    ll.set(0, {123, 456, 789, 1234567890});
    ll.set(1, {234, 567, 891, 1234567890});
    ll.set(2, {345, 678, 912, 1234567890});

    EXPECT_EQ(
        "[ [123, 456, 789, 1234567890],\n"
        "  [234, 567, 891, 1234567890],\n"
        "  [345, 678, 912, 1234567890] ]",
        prettyPrint(ll).flatten());

    EXPECT_EQ(
        "( int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    root.initList8(0);

    EXPECT_EQ(
        "( list8 = [],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    auto l8 = root.initList8(1);
    l8[0].setF(12);

    EXPECT_EQ(
        "( list8 = [(f = 12)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());

    l8 = root.initList8(2);
    l8[0].setF(12);
    l8[1].setF(34);

    EXPECT_EQ(
        "( list8 = [(f = 12), (f = 34)],\n"
        "  int32ListList = [\n"
        "    [123, 456, 789, 1234567890],\n"
        "    [234, 567, 891, 1234567890],\n"
        "    [345, 678, 912, 1234567890] ] )",
        prettyPrint(root).flatten());
  }

  {
    auto root = builder.initRoot<test::TestStructUnion>();

    auto s = root.getUn().initStruct();
    EXPECT_EQ(
        "(un = (struct = ()))",
        prettyPrint(root).flatten());

    s.setSomeText("foo");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (someText = \"foo\") ) )",
        prettyPrint(root).flatten());

    s.setMoreText("baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar");
    EXPECT_EQ(
        "( un = (\n"
        "    struct = (\n"
        "      someText = \"foo\",\n"
        "      moreText = \"baaaaaaaaaaaaaaaaaaaaaaaaaaaaaar\" ) ) )",
        prettyPrint(root).flatten());
  }
}